

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbvthandler.cpp
# Opt level: O1

void __thiscall QFbVtHandler::~QFbVtHandler(QFbVtHandler *this)

{
  *(undefined ***)this = &PTR_metaObject_001565c0;
  setKeyboardEnabled(this,true);
  setTTYCursor(true);
  if (*(long *)(this + 0x20) != 0) {
    close(*(int *)(this + 0x18));
    close(*(int *)(this + 0x1c));
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QFbVtHandler::~QFbVtHandler()
{
#ifdef VTH_ENABLED
    setKeyboardEnabled(true);
    setTTYCursor(true);

    if (m_signalNotifier) {
        close(m_sigFd[0]);
        close(m_sigFd[1]);
    }
#endif
}